

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t __thiscall
CTcTokenizer::xlat_string_to
          (CTcTokenizer *this,char *dstp,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,
          int force_embed_end)

{
  int iVar1;
  tc_toktyp_t tVar2;
  wchar_t wVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  CTcTokenizer *in_RCX;
  char *in_RSI;
  long in_RDI;
  tok_embed_ctx *in_R8;
  int in_R9D;
  CTcToken ftok;
  utf8_ptr dst_1;
  utf8_ptr fmt;
  tc_toktyp_t tt;
  char *buf;
  size_t charlen;
  utf8_ptr dp;
  size_t bytelen;
  int qcnt;
  wchar_t cur;
  int triple;
  wchar_t qu;
  utf8_ptr dst;
  undefined4 in_stack_fffffffffffffec8;
  wchar_t in_stack_fffffffffffffecc;
  tok_embed_ctx *in_stack_fffffffffffffed0;
  CTcTokenizer *pCVar7;
  utf8_ptr *in_stack_fffffffffffffed8;
  CTcTokenizer *in_stack_fffffffffffffee0;
  utf8_ptr *in_stack_fffffffffffffee8;
  tc_toktyp_t in_stack_fffffffffffffef0;
  tc_toktyp_t in_stack_fffffffffffffef4;
  tc_toktyp_t in_stack_fffffffffffffef8;
  wchar_t in_stack_fffffffffffffefc;
  utf8_ptr *in_stack_ffffffffffffff00;
  utf8_ptr *in_stack_ffffffffffffff08;
  CTcTokenizer *in_stack_ffffffffffffff10;
  tc_toktyp_t local_d0;
  tc_toktyp_t local_cc;
  tc_toktyp_t local_c8;
  tc_toktyp_t local_c4;
  CTcToken local_b0;
  utf8_ptr local_88;
  utf8_ptr local_80;
  tc_toktyp_t local_74;
  char *local_70;
  size_t local_68;
  size_t local_58;
  int local_50;
  uint local_48;
  wchar_t local_44;
  utf8_ptr local_40;
  int local_34;
  tok_embed_ctx *local_30;
  CTcTokenizer *local_28;
  char *local_18;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_fffffffffffffed0,
                     (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_44 = utf8_ptr::getch((utf8_ptr *)0x2e6b46);
  pCVar7 = local_28;
  if (local_44 == L'\"') {
    local_c4 = TOKT_DSTR;
  }
  else {
    if (local_44 == L'\'') {
      local_c8 = TOKT_SSTR;
    }
    else {
      if (local_44 == L'R') {
        local_cc = TOKT_RESTR;
      }
      else {
        if (local_30 == (tok_embed_ctx *)0x0) {
          local_d0 = TOKT_INVALID;
        }
        else {
          local_d0 = tok_embed_ctx::endtok(in_stack_fffffffffffffed0);
        }
        local_cc = local_d0;
      }
      local_c8 = local_cc;
    }
    local_c4 = local_c8;
  }
  CTcToken::settyp((CTcToken *)pCVar7,local_c4);
  if (local_44 == L'R') {
    utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
    local_44 = utf8_ptr::getch((utf8_ptr *)0x2e6c0f);
  }
  local_48 = 0;
  if ((local_44 == L'\"') || (local_44 == L'\'')) {
    iVar1 = count_quotes((utf8_ptr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    if (2 < iVar1) {
      utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
      utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
    }
    local_48 = (uint)(2 < iVar1);
  }
  utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
  if (local_34 == 0) {
    if ((local_44 == L'>') && (iVar1 = tok_embed_ctx::parens(in_stack_fffffffffffffed0), iVar1 == 0)
       ) {
      utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
      local_44 = tok_embed_ctx::qu(in_stack_fffffffffffffed0);
      local_48 = tok_embed_ctx::triple(in_stack_fffffffffffffed0);
      tok_embed_ctx::end_expr(local_30);
    }
  }
  else {
    utf8_ptr::dec((utf8_ptr *)in_stack_fffffffffffffed0);
    local_44 = tok_embed_ctx::qu(in_stack_fffffffffffffed0);
    local_48 = tok_embed_ctx::triple(in_stack_fffffffffffffed0);
    pCVar7 = local_28;
    tVar2 = tok_embed_ctx::endtok(in_stack_fffffffffffffed0);
    CTcToken::settyp((CTcToken *)pCVar7,tVar2);
    tok_embed_ctx::end_expr(local_30);
  }
  while( true ) {
    while( true ) {
      wVar3 = utf8_ptr::getch((utf8_ptr *)0x2e6d65);
      if (wVar3 == local_44) {
        if (local_48 == 0) {
          utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
          goto LAB_002e72a6;
        }
        local_50 = count_quotes((utf8_ptr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        if (2 < local_50) goto LAB_002e6db1;
      }
      if (wVar3 == L'\0') {
        pcVar4 = utf8_ptr::getptr(&local_40);
        local_58 = (long)pcVar4 - (long)local_18;
        CTcToken::set_text((CTcToken *)local_28,local_18,local_58);
        utf8_ptr::setch((utf8_ptr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_fffffffffffffed0,
                           (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_68 = utf8_ptr::len((utf8_ptr *)in_stack_fffffffffffffed0,
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (0x14 < local_68) {
          local_58 = utf8_ptr::bytelen((utf8_ptr *)in_stack_fffffffffffffed0,
                                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                                      );
        }
        sVar5 = CTcToken::get_text_len((CTcToken *)local_28);
        if (((sVar5 == 0) && (local_44 == L'\"')) &&
           (sVar5 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xc0)), sVar5 != 0)) {
          CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xc0));
          CTcTokString::ensure_space
                    ((CTcTokString *)in_stack_fffffffffffffed0,
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          pcVar4 = CTcTokString::get_buf((CTcTokString *)(in_RDI + 0xc0));
          pcVar6 = pcVar4 + 1;
          local_70 = pcVar4;
          sVar5 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xc0));
          memmove(pcVar6,pcVar4,sVar5);
          sVar5 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xc0));
          CTcTokString::set_text_len((CTcTokString *)(in_RDI + 0xc0),sVar5 + 1);
          *local_70 = '\"';
          return TOKT_NULLTOK;
        }
        log_error(0x2b11,(ulong)(uint)(int)(char)local_44,local_58 & 0xffffffff,local_18,
                  (ulong)(uint)(int)(char)local_44);
        tVar2 = CTcToken::gettyp((CTcToken *)local_28);
        return tVar2;
      }
      if (wVar3 != L'\\') break;
      xlat_escape(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                  in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    }
    if (((local_30 != (tok_embed_ctx *)0x0) &&
        (tVar2 = CTcToken::gettyp((CTcToken *)local_28), tVar2 != TOKT_RESTR)) &&
       ((wVar3 == L'<' &&
        (wVar3 = utf8_ptr::getch_at((utf8_ptr *)in_stack_fffffffffffffed0,
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
        wVar3 == L'<')))) break;
    utf8_ptr::setch((utf8_ptr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
  }
  local_74 = CTcToken::gettyp((CTcToken *)local_28);
  if (local_74 == TOKT_DSTR) {
    tVar2 = TOKT_DSTR_START;
  }
  else if (local_74 == TOKT_DSTR_END) {
    in_stack_fffffffffffffef8 = TOKT_DSTR_MID;
    tVar2 = TOKT_DSTR_MID;
  }
  else if (local_74 == TOKT_SSTR) {
    in_stack_fffffffffffffef4 = TOKT_SSTR_START;
    in_stack_fffffffffffffef8 = in_stack_fffffffffffffef4;
    tVar2 = in_stack_fffffffffffffef4;
  }
  else {
    in_stack_fffffffffffffef0 = local_74;
    in_stack_fffffffffffffef4 = local_74;
    in_stack_fffffffffffffef8 = local_74;
    tVar2 = local_74;
    if (local_74 == TOKT_SSTR_END) {
      in_stack_fffffffffffffef0 = TOKT_SSTR_MID;
      in_stack_fffffffffffffef4 = in_stack_fffffffffffffef0;
      in_stack_fffffffffffffef8 = in_stack_fffffffffffffef0;
      tVar2 = in_stack_fffffffffffffef0;
    }
  }
  pCVar7 = local_28;
  CTcToken::settyp((CTcToken *)local_28,tVar2);
  utf8_ptr::inc_by((utf8_ptr *)in_stack_fffffffffffffed0,
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  wVar3 = utf8_ptr::getch((utf8_ptr *)0x2e7179);
  if (wVar3 == L'%') {
    utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_fffffffffffffed0,
                       (utf8_ptr *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    scan_sprintf_spec(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_fffffffffffffed0,
                       (utf8_ptr *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    xlat_escapes(pCVar7,(utf8_ptr *)CONCAT44(tVar2,in_stack_fffffffffffffef8),
                 (utf8_ptr *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
    CTcToken::CTcToken(&local_b0);
    pcVar4 = utf8_ptr::getptr(&local_80);
    in_stack_fffffffffffffee0 = (CTcTokenizer *)utf8_ptr::getptr(&local_88);
    pcVar6 = utf8_ptr::getptr(&local_80);
    CTcToken::set_text(&local_b0,pcVar4,(long)in_stack_fffffffffffffee0 - (long)pcVar6);
    CTcToken::settyp(&local_b0,TOKT_FMTSPEC);
    push(pCVar7,(CTcToken *)CONCAT44(tVar2,in_stack_fffffffffffffef8));
  }
  tok_embed_ctx::start_expr
            ((tok_embed_ctx *)in_stack_fffffffffffffee0,
             (wchar_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
             (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
LAB_002e72a6:
  pCVar7 = local_28;
  pcVar4 = local_18;
  pcVar6 = utf8_ptr::getptr(&local_40);
  CTcToken::set_text((CTcToken *)pCVar7,pcVar4,(long)pcVar6 - (long)local_18);
  utf8_ptr::setch((utf8_ptr *)pCVar7,in_stack_fffffffffffffecc);
  tVar2 = CTcToken::gettyp((CTcToken *)local_28);
  return tVar2;
LAB_002e6db1:
  while (3 < local_50) {
    utf8_ptr::setch((utf8_ptr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    local_50 = local_50 + -1;
    utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffed0);
  }
  utf8_ptr::inc_by((utf8_ptr *)in_stack_fffffffffffffed0,
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  goto LAB_002e72a6;
}

Assistant:

tc_toktyp_t CTcTokenizer::xlat_string_to(
    char *dstp, utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec,
    int force_embed_end)
{
    /* set up our output utf8 pointer */
    utf8_ptr dst(dstp);

    /* note the open quote character */
    wchar_t qu = p->getch();

    /* set the appropriate string token type */
    tok->settyp(qu == '"' ? TOKT_DSTR :
                qu == '\'' ? TOKT_SSTR :
                qu == 'R' ? TOKT_RESTR :
                ec != 0 ? ec->endtok() :
                TOKT_INVALID);

    /* if it's a regex string, skip the 'R' and note the actual quote type */
    if (qu == 'R')
    {
        p->inc();
        qu = p->getch();
    }

    /* 
     *   If we're at a quote (rather than at '>>' for continuing from an
     *   embedded expression), count consecutive open quotes, to determine if
     *   we're in a triple-quoted string.  
     */
    int triple = FALSE;
    if (qu == '"' || qu == '\'')
    {
        /* count the consecutive open quotes */
        if (count_quotes(p, qu) >= 3)
        {
            /* skip past the additional two open quotes */
            p->inc();
            p->inc();

            /* note that we're in a triple-quoted string */
            triple = TRUE;
        }
    }

    /* skip the open quote */
    p->inc();

    /* check for the end of an embedded expression (forced or actual) */
    if (force_embed_end)
    {
        /* 
         *   they want us to assume the embedding ends here, regardless of
         *   what we're looking at - act the same as though we had
         *   actually seen '>>', but don't skip any input (in fact, back
         *   up one, since we already skipped one character for what we
         *   had thought was the open quote 
         */
        p->dec();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();
        tok->settyp(ec->endtok());

        /* clear the caller's in-embedding status */
        ec->end_expr();
    }
    else if (qu == '>' && ec->parens() == 0)
    {
        /* skip the second '>' */
        p->inc();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();

        /* end the expression */
        ec->end_expr();
    }

    /* scan the string and translate quotes */
    for (;;)
    {
        /* get this character */
        wchar_t cur = p->getch();

        /* if this is the matching quote, we're done */
        if (cur == qu)
        {
            /* 
             *   If we're in a triple-quote string, count consecutive quotes.
             *   Triple quotes are greedy: if we have N>3 quotes in a row,
             *   the first N-3 are inside the string, and the last 3 are the
             *   terminating quotes. 
             */
            if (triple)
            {
                /* we need at least three quotes to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* copy all but the last three quotes to the output */
                    for ( ; qcnt > 3 ; --qcnt, p->inc())
                        dst.setch(qu);

                    /* skip the three quotes */
                    p->inc_by(3);

                    /* done with the string */
                    break;
                }
            }
            else
            {
                /* 
                 *   It's an ordinary string, which ends with just one
                 *   matching quote, so we're done no matter what follows.
                 *   Skip the quote and stop scanning.
                 */
                p->inc();
                break;
            }
        }

        /* 
         *   if we find an end-of-line within the string, it's an error -
         *   we should always splice strings together onto a single line
         *   before starting to tokenize the line 
         */
        if (cur == '\0')
        {
            /* set the token's text pointer */
            size_t bytelen = dst.getptr() - dstp;
            tok->set_text(dstp, bytelen);

            /* null-terminate the result string */
            dst.setch('\0');

            /* 
             *   get the length of the unterminated string so far, but for
             *   error logging, limit the length to twenty characters --
             *   we just want to give the user enough information to find
             *   the string in error, without making the error message
             *   huge 
             */
            utf8_ptr dp(dstp);
            size_t charlen = dp.len(bytelen);
            if (charlen > 20)
                bytelen = dp.bytelen(20);

            /*
             *   Check for a special heuristic case.  If the string was of
             *   zero length, and we have something sitting in our
             *   unsplice buffer, here's what probably happened: the input
             *   was missing a ">>" sequence at the end of an embedded
             *   expression, and the parser told us to put it back in.  We
             *   had earlier decided we needed to splice up to a quote to
             *   end what looked to us like an unterminated string.  If
             *   this is the case, we and the parser are working at cross
             *   purposes; the parser is smarter than we are, so we should
             *   synchronize with it.  
             */
            if (tok->get_text_len() == 0
                && qu == '"'
                && unsplicebuf_.get_text_len() != 0)
            {
                /* 
                 *   we must have spliced a line to finish a string -
                 *   insert the quote into the splice buffer, and ignore
                 *   it here 
                 */

                /* 
                 *   make sure there's room for one more character (plus a
                 *   null byte) 
                 */
                unsplicebuf_.ensure_space(unsplicebuf_.get_text_len() + 2);

                /* get the buffer pointer */
                char *buf = unsplicebuf_.get_buf();

                /* make room for the '"' */
                memmove(buf + 1, buf, unsplicebuf_.get_text_len());
                unsplicebuf_.set_text_len(unsplicebuf_.get_text_len() + 1);

                /* add the '"' */
                *buf = '"';

                /* 
                 *   return the 'null token' to tell the caller to try
                 *   again - do not log an error at this point 
                 */
                return TOKT_NULLTOK;
            }

            /* log the error */
            log_error(TCERR_UNTERM_STRING,
                      (char)qu, (int)bytelen, dstp, (char)qu);

            /* return the string type */
            return tok->gettyp();
        }

        /* if this is an escape, translate it */
        if (cur == '\\')
        {
            /* translate the escape */
            xlat_escape(&dst, p, qu, triple);
            continue;
        }
        else if (ec != 0
                 && tok->gettyp() != TOKT_RESTR
                 && cur == '<' && p->getch_at(1) == '<')
        {
            /* 
             *   It's the start of an embedded expression - change the type
             *   to so indicate.  If we think we have a regular SSTR or DSTR,
             *   switch to the appropriate START type, since the part up to
             *   here is actually the starting fragment of a string with an
             *   embedded expression.  If we think we're in an END section,
             *   switch to the corresponding MID section, since we're parsing
             *   a fragment that already followed an embedding.  The only
             *   other possibility is that we're in a MID section, in which
             *   case just stay in the same MID section.  
             */
            tc_toktyp_t tt = tok->gettyp();
            tok->settyp(tt == TOKT_DSTR ? TOKT_DSTR_START :
                        tt == TOKT_DSTR_END ? TOKT_DSTR_MID :
                        tt == TOKT_SSTR ? TOKT_SSTR_START :
                        tt == TOKT_SSTR_END ? TOKT_SSTR_MID :
                        tt);

            /* skip the << */
            p->inc_by(2);

            /*
             *   Check for a '%' sprintf-style formatting sequence.  If we
             *   have a '%' immediately after the second '<', it's a sprintf
             *   format code. 
             */
            if (p->getch() == '%')
            {
                /* remember the starting point of the format string */
                utf8_ptr fmt(p);

                /* scan the format spec */
                scan_sprintf_spec(p);

                /* translate escapes */
                utf8_ptr dst(&fmt);
                xlat_escapes(&dst, &fmt, p);

                /* push the format spec into the token stream */
                CTcToken ftok;
                ftok.set_text(fmt.getptr(), dst.getptr() - fmt.getptr());
                ftok.settyp(TOKT_FMTSPEC);
                push(&ftok);
            }

            /* tell the caller we're in an embedding */
            ec->start_expr(qu, triple, TRUE);

            /* stop scanning */
            break;
        }

        /* copy this character to the output position */
        dst.setch(cur);

        /* get the next character */
        p->inc();
    }

    /* set the token's text pointer */
    tok->set_text(dstp, dst.getptr() - dstp);

    /* null-terminate the result string */
    dst.setch('\0');

    /* return the string type */
    return tok->gettyp();
}